

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O0

void warn_cuc(guint8 *t)

{
  long in_RDI;
  size_t i;
  char obet [15];
  ulong local_20;
  char local_17 [23];
  
  for (local_20 = 0; local_20 < 7; local_20 = local_20 + 1) {
    local_17[local_20 * 2] = "0123456789abcdef"[(int)(uint)*(byte *)(in_RDI + local_20) >> 4];
    local_17[local_20 * 2 + 1] = "0123456789abcdef"[(int)(*(byte *)(in_RDI + local_20) & 0xf)];
  }
  local_17[0xe] = 0;
  _p2sc_msg("warn_cuc",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_time.c"
            ,0x26,"$Id: p2sc_time.c 5348 2018-04-25 13:55:17Z bogdan $",0xce4,"Corrupted OBET: %s",
            local_17);
  return;
}

Assistant:

static void warn_cuc(const guint8 t[SIZEOF_CUC]) {
    static const char hex[] = "0123456789abcdef";
    char obet[2 * SIZEOF_CUC + 1];

    for (size_t i = 0; i < SIZEOF_CUC; ++i) {
        obet[2 * i] = hex[t[i] >> 4];
        obet[2 * i + 1] = hex[t[i] & 0xf];
    }
    obet[2 * SIZEOF_CUC] = 0;

    P2SC_Msg(LVL_WARNING_CORRUPT_INPUT_DATA, "Corrupted OBET: %s", obet);
}